

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_resume_normal_shape(player *p)

{
  player_shape *ppVar1;
  player *p_local;
  
  ppVar1 = lookup_player_shape("normal");
  p->shape = ppVar1;
  msg("You resume your usual shape.");
  player_clear_timed(p,L'*',true,false);
  p->upkeep->update = p->upkeep->update | 1;
  p->upkeep->redraw = p->upkeep->redraw | 3;
  handle_stuff(p);
  return;
}

Assistant:

void player_resume_normal_shape(struct player *p)
{
	p->shape = lookup_player_shape("normal");
	msg("You resume your usual shape.");

	/* Kill vampire attack */
	(void) player_clear_timed(p, TMD_ATT_VAMP, true, false);

	/* Update */
	p->upkeep->update |= (PU_BONUS);
	p->upkeep->redraw |= (PR_TITLE | PR_MISC);
	handle_stuff(p);
}